

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatterTest_Fill_Test::TestBody(FormatterTest_Fill_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  format_error *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_1;
  format_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8d0;
  undefined7 in_stack_fffffffffffff8d8;
  undefined1 in_stack_fffffffffffff8df;
  char *in_stack_fffffffffffff8e0;
  basic_string_view<char> *this_01;
  char *in_stack_fffffffffffff8e8;
  int iVar3;
  allocator *expected_expression;
  char *in_stack_fffffffffffff8f0;
  undefined4 in_stack_fffffffffffff8f8;
  Type in_stack_fffffffffffff8fc;
  Type type;
  AssertionResult *in_stack_fffffffffffff900;
  AssertHelper *this_02;
  char (*in_stack_fffffffffffff908) [9];
  undefined7 in_stack_fffffffffffff910;
  basic_string_view<char> *format_str;
  Message *in_stack_fffffffffffff948;
  Message *message;
  AssertHelper *in_stack_fffffffffffff950;
  basic_string_view<char> local_520;
  string local_510 [39];
  allocator local_4e9;
  string local_4e8 [32];
  AssertionResult local_4c8 [2];
  AssertHelper local_4a8 [4];
  AssertionResult local_488 [2];
  undefined8 local_468;
  basic_string_view<char> local_460 [2];
  AssertionResult local_440 [2];
  string local_420 [32];
  AssertionResult local_400 [2];
  undefined1 local_3d9;
  Message local_3d8 [4];
  AssertionResult local_3b8 [2];
  longdouble local_398;
  string local_388 [32];
  AssertionResult local_368 [2];
  undefined8 local_348;
  string local_340 [32];
  AssertionResult local_320 [2];
  undefined8 local_300;
  string local_2f8 [32];
  AssertionResult local_2d8 [2];
  undefined8 local_2b8;
  string local_2b0 [32];
  AssertionResult local_290 [2];
  undefined8 local_270;
  string local_268 [32];
  AssertionResult local_248 [2];
  undefined8 local_228;
  string local_220 [32];
  AssertionResult local_200 [2];
  undefined4 local_1dc;
  string local_1d8 [32];
  AssertionResult local_1b8 [2];
  undefined4 local_194;
  string local_190 [32];
  AssertionResult local_170 [2];
  undefined4 local_14c;
  string local_148 [32];
  AssertionResult local_128 [3];
  undefined1 local_f1;
  string local_f0 [38];
  byte local_ca;
  allocator local_c9;
  string local_c8 [32];
  AssertionResult local_a8 [3];
  int local_78;
  undefined1 local_71;
  string local_70 [38];
  byte local_4a;
  allocator local_49;
  string local_48 [48];
  AssertionResult local_18;
  
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"invalid fill character \'{\'",&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_4a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_71 = 99;
      fmt::v5::format<char[8],char>
                ((char (*) [8])in_stack_fffffffffffff908,&in_stack_fffffffffffff900->success_);
      std::__cxx11::string::~string(local_70);
    }
    if ((local_4a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff900,
                 (char (*) [104])CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
      local_78 = 2;
    }
    else {
      local_78 = 0;
    }
    std::__cxx11::string::~string(local_48);
    if (local_78 != 0) goto LAB_0013d930;
  }
  else {
LAB_0013d930:
    testing::Message::Message((Message *)in_stack_fffffffffffff900);
    testing::AssertionResult::failure_message((AssertionResult *)0x13d94c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               in_stack_fffffffffffff8e0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8d0);
    testing::Message::~Message((Message *)0x13d9af);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13da07);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"invalid fill character \'{\'",&local_c9);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    local_ca = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_f1 = 99;
      fmt::v5::format<char[9],char>(in_stack_fffffffffffff908,&in_stack_fffffffffffff900->success_);
      std::__cxx11::string::~string(local_f0);
    }
    if ((local_ca & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff900,
                 (char (*) [105])CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
      local_78 = 3;
    }
    else {
      local_78 = 0;
    }
    std::__cxx11::string::~string(local_c8);
    if (local_78 == 0) goto LAB_0013de74;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffff900);
  testing::AssertionResult::failure_message((AssertionResult *)0x13ddc6);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
             in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
             in_stack_fffffffffffff8e0);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8d0);
  testing::Message::~Message((Message *)0x13de29);
LAB_0013de74:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13de81);
  local_14c = 0x2a;
  fmt::v5::format<char[8],int>
            ((char (*) [8])in_stack_fffffffffffff908,(int *)in_stack_fffffffffffff900);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
             in_stack_fffffffffffff8d0);
  std::__cxx11::string::~string(local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_128);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff900);
    testing::AssertionResult::failure_message((AssertionResult *)0x13df7e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               in_stack_fffffffffffff8e0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8d0);
    testing::Message::~Message((Message *)0x13dfe1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13e039);
  local_194 = 0xffffffd6;
  fmt::v5::format<char[8],int>
            ((char (*) [8])in_stack_fffffffffffff908,(int *)in_stack_fffffffffffff900);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
             in_stack_fffffffffffff8d0);
  std::__cxx11::string::~string(local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_170);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff900);
    testing::AssertionResult::failure_message((AssertionResult *)0x13e136);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               in_stack_fffffffffffff8e0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8d0);
    testing::Message::~Message((Message *)0x13e199);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13e1f1);
  local_1dc = 0x2a;
  fmt::v5::format<char[8],unsigned_int>
            ((char (*) [8])in_stack_fffffffffffff908,(uint *)in_stack_fffffffffffff900);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
             in_stack_fffffffffffff8d0);
  std::__cxx11::string::~string(local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff900);
    testing::AssertionResult::failure_message((AssertionResult *)0x13e2ee);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               in_stack_fffffffffffff8e0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8d0);
    testing::Message::~Message((Message *)0x13e351);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13e3a9);
  local_228 = 0xffffffffffffffd6;
  fmt::v5::format<char[8],long>
            ((char (*) [8])in_stack_fffffffffffff908,(long *)in_stack_fffffffffffff900);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
             in_stack_fffffffffffff8d0);
  std::__cxx11::string::~string(local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_200);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff900);
    testing::AssertionResult::failure_message((AssertionResult *)0x13e4a7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               in_stack_fffffffffffff8e0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8d0);
    testing::Message::~Message((Message *)0x13e50a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13e562);
  local_270 = 0x2a;
  fmt::v5::format<char[8],unsigned_long>
            ((char (*) [8])in_stack_fffffffffffff908,(unsigned_long *)in_stack_fffffffffffff900);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
             in_stack_fffffffffffff8d0);
  std::__cxx11::string::~string(local_268);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_248);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff900);
    testing::AssertionResult::failure_message((AssertionResult *)0x13e660);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               in_stack_fffffffffffff8e0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8d0);
    testing::Message::~Message((Message *)0x13e6c3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13e71b);
  local_2b8 = 0xffffffffffffffd6;
  fmt::v5::format<char[8],long_long>
            ((char (*) [8])in_stack_fffffffffffff908,(longlong *)in_stack_fffffffffffff900);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
             in_stack_fffffffffffff8d0);
  std::__cxx11::string::~string(local_2b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_290);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff900);
    testing::AssertionResult::failure_message((AssertionResult *)0x13e819);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               in_stack_fffffffffffff8e0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8d0);
    testing::Message::~Message((Message *)0x13e87c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13e8d4);
  local_300 = 0x2a;
  fmt::v5::format<char[8],unsigned_long_long>
            ((char (*) [8])in_stack_fffffffffffff908,(unsigned_long_long *)in_stack_fffffffffffff900
            );
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
             in_stack_fffffffffffff8d0);
  std::__cxx11::string::~string(local_2f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff900);
    testing::AssertionResult::failure_message((AssertionResult *)0x13e9d2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               in_stack_fffffffffffff8e0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8d0);
    testing::Message::~Message((Message *)0x13ea35);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ea8d);
  local_348 = 0xc045000000000000;
  fmt::v5::format<char[8],double>
            ((char (*) [8])in_stack_fffffffffffff908,(double *)in_stack_fffffffffffff900);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
             in_stack_fffffffffffff8d0);
  std::__cxx11::string::~string(local_340);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_320);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff900);
    testing::AssertionResult::failure_message((AssertionResult *)0x13eb91);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               in_stack_fffffffffffff8e0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8d0);
    testing::Message::~Message((Message *)0x13ebf4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ec4c);
  local_398 = (longdouble)-42.0;
  fmt::v5::format<char[8],long_double>
            ((char (*) [8])in_stack_fffffffffffff908,(longdouble *)in_stack_fffffffffffff900);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
             in_stack_fffffffffffff8d0);
  std::__cxx11::string::~string(local_388);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_368);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff900);
    in_stack_fffffffffffff950 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x13ed4b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               in_stack_fffffffffffff8e0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8d0);
    testing::Message::~Message((Message *)0x13edae);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ee06);
  local_3d9 = 99;
  message = local_3d8;
  fmt::v5::format<char[8],char>
            ((char (*) [8])in_stack_fffffffffffff908,&in_stack_fffffffffffff900->success_);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
             in_stack_fffffffffffff8d0);
  std::__cxx11::string::~string((string *)local_3d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff900);
    testing::AssertionResult::failure_message((AssertionResult *)0x13eefa);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               in_stack_fffffffffffff8e0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff950,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8d0);
    testing::Message::~Message((Message *)0x13ef57);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13efaf);
  fmt::v5::format<char[8],char[4]>
            ((char (*) [8])in_stack_fffffffffffff908,&in_stack_fffffffffffff900->success_);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
             in_stack_fffffffffffff8d0);
  std::__cxx11::string::~string(local_420);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_400);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff900);
    testing::AssertionResult::failure_message((AssertionResult *)0x13f094);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               in_stack_fffffffffffff8e0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff950,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8d0);
    testing::Message::~Message((Message *)0x13f0f1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13f149);
  local_468 = 0xface;
  format_str = local_460;
  fmt::v5::format<char[8],void*>
            ((char (*) [8])in_stack_fffffffffffff908,(void **)in_stack_fffffffffffff900);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
             (char (*) [9])CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
             in_stack_fffffffffffff8d0);
  std::__cxx11::string::~string((string *)local_460);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_440);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff900);
    in_stack_fffffffffffff908 =
         (char (*) [9])testing::AssertionResult::failure_message((AssertionResult *)0x13f23b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
               in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               in_stack_fffffffffffff8e0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff950,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8d0);
    testing::Message::~Message((Message *)0x13f298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13f2f0);
  this_02 = local_4a8;
  fmt::v5::format<char[5],char[4]>((char (*) [5])in_stack_fffffffffffff908,(char (*) [4])this_02);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
             (char (*) [5])CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
             in_stack_fffffffffffff8d0);
  iVar3 = (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20);
  std::__cxx11::string::~string((string *)local_4a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_488);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffff8fc);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    in_stack_fffffffffffff8f0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x13f3d5);
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,in_stack_fffffffffffff8f0,iVar3,in_stack_fffffffffffff8e0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff950,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8d0);
    testing::Message::~Message((Message *)0x13f432);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13f48a);
  expected_expression = &local_4e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e8,"",4,expected_expression);
  this_01 = &local_520;
  fmt::v5::basic_string_view<char>::basic_string_view(this_01,"{:",6);
  fmt::v5::format<fmt::v5::basic_string_view<char>,char>
            (format_str,(char *)CONCAT17(uVar2,in_stack_fffffffffffff910));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)expected_expression,(char *)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),in_stack_fffffffffffff8d0
            );
  iVar3 = (int)((ulong)expected_expression >> 0x20);
  std::__cxx11::string::~string(local_510);
  std::__cxx11::string::~string(local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4c8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x13f62a)
    ;
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,in_stack_fffffffffffff8f0,iVar3,(char *)this_01);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff950,message);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x13f687);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13f6dc);
  return;
}

Assistant:

TEST(FormatterTest, Fill) {
  EXPECT_THROW_MSG(format("{0:{<5}", 'c'),
      format_error, "invalid fill character '{'");
  EXPECT_THROW_MSG(format("{0:{<5}}", 'c'),
      format_error, "invalid fill character '{'");
  EXPECT_EQ("**42", format("{0:*>4}", 42));
  EXPECT_EQ("**-42", format("{0:*>5}", -42));
  EXPECT_EQ("***42", format("{0:*>5}", 42u));
  EXPECT_EQ("**-42", format("{0:*>5}", -42l));
  EXPECT_EQ("***42", format("{0:*>5}", 42ul));
  EXPECT_EQ("**-42", format("{0:*>5}", -42ll));
  EXPECT_EQ("***42", format("{0:*>5}", 42ull));
  EXPECT_EQ("**-42", format("{0:*>5}", -42.0));
  EXPECT_EQ("**-42", format("{0:*>5}", -42.0l));
  EXPECT_EQ("c****", format("{0:*<5}", 'c'));
  EXPECT_EQ("abc**", format("{0:*<5}", "abc"));
  EXPECT_EQ("**0xface", format("{0:*>8}", reinterpret_cast<void*>(0xface)));
  EXPECT_EQ("foo=", format("{:}=", "foo"));
  EXPECT_EQ(std::string("\0\0\0*", 4), format(string_view("{:\0>4}", 6), '*'));
}